

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::ReplaceStringInPlace
               (string *subject,char *search,int searchSize,char *replace,int replaceSize,
               size_t *firstReplacementIndex)

{
  ulong uVar1;
  bool bVar2;
  undefined4 in_register_00000084;
  
  bVar2 = false;
  while (uVar1 = std::__cxx11::string::find((char *)subject,(ulong)search),
        uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)subject,uVar1,(char *)(ulong)(uint)searchSize);
    if (!bVar2) {
      *(ulong *)CONCAT44(in_register_00000084,replaceSize) = uVar1;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

static bool ReplaceStringInPlace(
    std::string& subject,
    const char* search,
    int searchSize,
    const char* replace,
    int replaceSize,
    std::size_t& firstReplacementIndex)
{
    bool changed{false};
    std::size_t pos{0};
    while ((pos = subject.find(search, pos)) != std::string::npos) {
        subject.replace(pos, searchSize, replace);
        if (!changed) {
            changed = true;
            firstReplacementIndex = pos;
        }
        pos += replaceSize;
    }
    return changed;
}